

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall llm_graph_input_cls::set_input(llm_graph_input_cls *this,llama_ubatch *ubatch)

{
  int iVar1;
  value_type vVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  reference pvVar8;
  long in_RSI;
  long in_RDI;
  int i_2;
  llama_pos pos_1;
  int i_1;
  llama_seq_id seq_id_1;
  int s_1;
  vector<int,_std::allocator<int>_> last_row;
  vector<int,_std::allocator<int>_> last_pos;
  uint32_t *data_1;
  int64_t n_seqs_1;
  int64_t n_seq_tokens_1;
  int64_t n_tokens_1;
  llama_pos pos;
  int i;
  llama_seq_id seq_id;
  int s;
  uint32_t *data;
  int64_t n_seqs;
  int64_t n_seq_tokens;
  int64_t n_tokens;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  value_type vVar9;
  value_type_conflict3 *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_fffffffffffffef8;
  undefined1 *__n;
  vector<int,_std::allocator<int>_> *this_01;
  int local_c4;
  int local_bc;
  int local_b4;
  undefined1 local_ad;
  undefined4 local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  undefined4 local_7c;
  vector<int,_std::allocator<int>_> local_78;
  long local_60;
  ulong local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_10 = in_RSI;
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x38) & 1) != 0) &&
     ((*(int *)(*(long *)(in_RDI + 0x10) + 0x40) == 2 ||
      (*(int *)(*(long *)(in_RDI + 0x10) + 0x40) == 4)))) {
    local_18 = (ulong)*(uint *)(in_RSI + 4);
    local_20 = (ulong)*(uint *)(in_RSI + 8);
    local_28 = (ulong)*(uint *)(in_RSI + 0xc);
    if (*(long *)(in_RDI + 8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0xca,"GGML_ASSERT(%s) failed","cls");
    }
    uVar5 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    uVar7 = local_18;
    if ((uVar5 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0xcb,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(cls->buffer)");
    }
    local_30 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    pvVar3 = *(void **)(*(long *)(in_RDI + 8) + 0xf8);
    lVar6 = ggml_element_size(*(undefined8 *)(in_RDI + 8));
    memset(pvVar3,0,uVar7 * lVar6);
    for (local_34 = 0; (long)local_34 < (long)local_28; local_34 = local_34 + 1) {
      local_38 = **(int **)(*(long *)(local_10 + 0x30) + (long)local_34 * 8);
      if ((long)local_18 <= (long)local_38) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0xd4,"GGML_ASSERT(%s) failed",
                   "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK\""
                  );
      }
      for (local_3c = 0; (long)local_3c < (long)local_20; local_3c = local_3c + 1) {
        local_40 = *(int *)(*(long *)(local_10 + 0x20) +
                           ((long)local_34 * local_20 + (long)local_3c) * 4);
        if (local_40 == 0) {
          *(int *)(local_30 + (long)local_38 * 4) = local_34 * (int)local_20 + local_3c;
        }
      }
    }
  }
  if (((*(byte *)(*(long *)(in_RDI + 0x10) + 0x38) & 1) != 0) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 0x40) == 3)) {
    local_48 = (vector<int,_std::allocator<int>_> *)(ulong)*(uint *)(local_10 + 4);
    local_50 = (ulong)*(uint *)(local_10 + 8);
    local_58 = (ulong)*(uint *)(local_10 + 0xc);
    if (*(long *)(in_RDI + 8) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0xe5,"GGML_ASSERT(%s) failed","cls");
    }
    uVar7 = ggml_backend_buffer_is_host(*(undefined8 *)(*(long *)(in_RDI + 8) + 8));
    if ((uVar7 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0xe6,"GGML_ASSERT(%s) failed","ggml_backend_buffer_is_host(cls->buffer)");
    }
    local_60 = *(long *)(*(long *)(in_RDI + 8) + 0xf8);
    pvVar3 = *(void **)(*(long *)(in_RDI + 8) + 0xf8);
    this_01 = local_48;
    lVar6 = ggml_element_size();
    memset(pvVar3,0,(long)this_01 * lVar6);
    local_7c = 0xffffffff;
    std::allocator<int>::allocator((allocator<int> *)0x431445);
    std::vector<int,_std::allocator<int>_>::vector
              (this_01,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::allocator<int>::~allocator((allocator<int> *)0x431473);
    local_ac = 0xffffffff;
    __n = &local_ad;
    this_00 = local_48;
    std::allocator<int>::allocator((allocator<int> *)0x431497);
    std::vector<int,_std::allocator<int>_>::vector
              (this_01,(size_type)__n,(value_type_conflict3 *)this_00,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::allocator<int>::~allocator((allocator<int> *)0x4314bf);
    for (local_b4 = 0; (long)local_b4 < (long)local_58; local_b4 = local_b4 + 1) {
      iVar1 = **(int **)(*(long *)(local_10 + 0x30) + (long)local_b4 * 8);
      if ((long)local_48 <= (long)iVar1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0xf2,"GGML_ASSERT(%s) failed",
                   "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == LAST\""
                  );
      }
      for (local_bc = 0; (long)local_bc < (long)local_50; local_bc = local_bc + 1) {
        vVar2 = *(value_type *)
                 (*(long *)(local_10 + 0x20) + ((long)local_b4 * local_50 + (long)local_bc) * 4);
        vVar9 = vVar2;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar1);
        if (*pvVar8 <= vVar9) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,(long)iVar1);
          *pvVar8 = vVar2;
          iVar4 = local_b4 * (int)local_50 + local_bc;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)iVar1);
          *pvVar8 = iVar4;
        }
      }
    }
    for (local_c4 = 0; (long)local_c4 < (long)local_48; local_c4 = local_c4 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_c4);
      if (-1 < *pvVar8) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_c4);
        *(value_type *)(local_60 + (long)local_c4 * 4) = *pvVar8;
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
    std::vector<int,_std::allocator<int>_>::~vector(this_00);
  }
  return;
}

Assistant:

void llm_graph_input_cls::set_input(const llama_ubatch * ubatch) {
    if (cparams.embeddings && (
                cparams.pooling_type == LLAMA_POOLING_TYPE_CLS ||
                cparams.pooling_type == LLAMA_POOLING_TYPE_RANK)) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos == 0) {
                    data[seq_id] = s*n_seq_tokens + i;
                }
            }
        }
    }

    if (cparams.embeddings && cparams.pooling_type == LLAMA_POOLING_TYPE_LAST) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        std::vector<int> last_pos(n_tokens, -1);
        std::vector<int> last_row(n_tokens, -1);

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == LAST");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos >= last_pos[seq_id]) {
                    last_pos[seq_id] = pos;
                    last_row[seq_id] = s*n_seq_tokens + i;
                }
            }
        }

        for (int i = 0; i < n_tokens; ++i) {
            if (last_row[i] >= 0) {
                data[i] = last_row[i];
            }
        }
    }
}